

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-in-a-row.c
# Opt level: O0

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *stream_00;
  int iVar1;
  uv_buf_t uVar2;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  char *pcStack_10070;
  uv_write_t *write_req;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int iStack_10038;
  int r;
  int j;
  int i;
  uv_stream_t *stream;
  uv_buf_t send_bufs [4096];
  int status_local;
  uv_connect_t *req_local;
  
  stream_00 = connect_req.handle;
  if (req != &connect_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x76,"req","==","&connect_req",req,"==",&connect_req);
    abort();
  }
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x77,"status","==","0",(long)status,"==",0);
    abort();
  }
  connect_cb_called = connect_cb_called + 1;
  for (r = 0; r < 3; r = r + 1) {
    for (iStack_10038 = 0; iStack_10038 < 0x1000; iStack_10038 = iStack_10038 + 1) {
      uVar2 = uv_buf_init(send_buffer + bytes_sent,0x2728);
      eval_a_2 = (int64_t)uVar2.base;
      send_bufs[(long)iStack_10038 + -1].len = eval_a_2;
      pcStack_10070 = (char *)uVar2.len;
      send_bufs[iStack_10038].base = pcStack_10070;
      bytes_sent = bytes_sent + 0x2728;
    }
    iVar1 = uv_write(write_reqs + r,stream_00,(uv_buf_t *)&stream,0x1000,write_cb);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
              ,0x86,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
  }
  iVar1 = uv_shutdown(&shutdown_req,stream_00,shutdown_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x8b,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_read_start(stream_00,alloc_cb,read_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x8f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void connect_cb(uv_connect_t* _, int status) {
  int r;
  uv_buf_t buf;
  size_t write_queue_size0, write_queue_size1;

  ASSERT_OK(status);
  connect_cb_called++;

  /* fire a big write */
  buf = uv_buf_init(data, sizeof(data));
  r = uv_write(&small_write, (uv_stream_t*) &client, &buf, 1, write_cb);
  ASSERT_OK(r);

  /* check that the write process gets stuck */
  write_queue_size0 = uv_stream_get_write_queue_size((uv_stream_t*) &client);
  ASSERT_GT(write_queue_size0, 0);

  /* fire a small write, which should be queued */
  buf = uv_buf_init("A", 1);
  r = uv_write(&big_write, (uv_stream_t*) &client, &buf, 1, write_cb);
  ASSERT_OK(r);

  write_queue_size1 = uv_stream_get_write_queue_size((uv_stream_t*) &client);
  ASSERT_EQ(write_queue_size1, write_queue_size0 + 1);
}